

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O2

string * __thiscall
BmsParseInvalidBarChangeValueException::Message_abi_cxx11_
          (string *__return_storage_ptr__,BmsParseInvalidBarChangeValueException *this)

{
  ostream *poVar1;
  stringstream os;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,anon_var_dwarf_33b38);
  std::operator<<(poVar1,(string *)&this->str_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string
BmsParseInvalidBarChangeValueException::Message( void ) const
{
  std::stringstream os;
  os << "小節長変更の値が不正です。不正な文字列 : " << str_;
  return os.str();
}